

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-huitre39.c
# Opt level: O2

xml_node * get_node_by_name(xml_node *base,uint8_t *name)

{
  int iVar1;
  size_t __n;
  uint8_t *__s;
  size_t sVar2;
  size_t sVar3;
  xml_node *pxVar4;
  size_t child;
  
  __n = strlen((char *)name);
  __s = xml_easy_name(base);
  sVar2 = strlen((char *)__s);
  if ((__n == sVar2) && (iVar1 = bcmp(name,__s,__n), iVar1 == 0)) {
    free(__s);
    pxVar4 = base;
  }
  else {
    free(__s);
    sVar3 = xml_node_children(base);
    if (sVar3 == 0) {
LAB_00101450:
      pxVar4 = (xml_node *)0x0;
    }
    else {
      child = 0;
      do {
        if (sVar3 == child) goto LAB_00101450;
        pxVar4 = xml_node_child(base,child);
        pxVar4 = get_node_by_name(pxVar4,name);
        child = child + 1;
      } while (pxVar4 == (xml_node *)0x0);
    }
  }
  return pxVar4;
}

Assistant:

static struct xml_node* get_node_by_name(struct xml_node* base, uint8_t* name) {


	/* Check whether `base` already has the tag name we are searching for
	 */
	size_t const name_length = strlen(name);

	uint8_t* base_name = xml_easy_name(base);
	size_t const base_name_length = strlen(base_name);


	/* Length of `name` and `base_name` do match, we should now do a real
	 * comparison
	 */
	if (name_length == base_name_length) {
		int const rs = memcmp(name, base_name, name_length);

		/* Names match! We have found an element which fullfills our
		 * search criteria
		 */
		if (!rs) {
			free(base_name);
			return base;
		}
	}


	/* Unfortunately, `base` is not the element we are looking for :-(
	 */
	free(base_name);


	/* Let's take a look at the children of `base`
	 */
	size_t const number_of_children = xml_node_children(base);


	/* No children → No luck with base
	 */
	if (!number_of_children) {
		return 0;
	}


	/* Recursivly look through all children
	 */
	size_t child = 0; for (; child < number_of_children; ++child) {
		struct xml_node* child_node = xml_node_child(base, child);

		/* Maybe this child does contain the element we are looking for?
		 */
		struct xml_node* search_result = get_node_by_name(
			child_node, name
		);

		/* We are lucky!
		 */
		if (search_result) {
			return search_result;
		}
	}


	/* No luck :-(
	 */
	return 0;
}